

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

int __thiscall
spdlog::pattern_formatter::clone
          (pattern_formatter *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  pointer pcVar2;
  pointer this_00;
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  __single_object cloned;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000028;
  value_type *it;
  const_iterator __end1;
  const_iterator __begin1;
  custom_flags *__range1;
  custom_flags cloned_custom_formatters;
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  *in_stack_ffffffffffffff58;
  int iVar3;
  pattern_formatter *__u;
  undefined1 local_70 [8];
  reference local_68;
  _Node_iterator_base<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false>
  local_60;
  _Node_iterator_base<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false>
  local_58;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *local_50;
  __fn *local_10;
  pattern_formatter *local_8;
  
  __u = this;
  local_10 = __fn;
  local_8 = this;
  std::
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  ::unordered_map((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                   *)0x1d96fb);
  local_50 = (unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
             ((long)__fn + 0xa8);
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
       ::begin(in_stack_ffffffffffffff58);
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
       ::end(in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_58,&local_60);
    if (!bVar1) break;
    local_68 = std::__detail::
               _Node_const_iterator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false,_false>
               ::operator*((_Node_const_iterator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false,_false>
                            *)0x1d974b);
    pcVar2 = std::
             unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>
             ::operator->((unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>
                           *)0x1d975e);
    (**(code **)(*(long *)pcVar2 + 0x18))(local_70);
    in_stack_ffffffffffffff58 =
         (unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
          *)std::
            unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
            ::operator[]((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                          *)this,(key_type *)in_stack_ffffffffffffff58);
    std::
    unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>::
    operator=((unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>
               *)this,(unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>
                       *)in_stack_ffffffffffffff58);
    std::
    unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>
                 *)this);
    std::__detail::
    _Node_const_iterator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false,_false>
    ::operator++((_Node_const_iterator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false,_false>
                  *)this);
  }
  std::
  make_unique<spdlog::pattern_formatter,std::__cxx11::string_const&,spdlog::pattern_time_type_const&,std::__cxx11::string_const&,std::unordered_map<char,std::unique_ptr<spdlog::custom_flag_formatter,std::default_delete<spdlog::custom_flag_formatter>>,std::hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::unique_ptr<spdlog::custom_flag_formatter,std::default_delete<spdlog::custom_flag_formatter>>>>>>
            (in_stack_00000028,
             (pattern_time_type *)
             cloned._M_t.
             super___uniq_ptr_impl<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
             ._M_t.
             super__Tuple_impl<0UL,_spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_>
             .super__Head_base<0UL,_spdlog::pattern_formatter_*,_false>._M_head_impl,
             in_stack_00000018,in_stack_00000010);
  this_00 = std::
            unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>::
            operator->((unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
                        *)0x1d980f);
  need_localtime(this_00,(bool)((byte)*(code *)((long)&(((
                                                  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>
                                                  *)((long)__fn + 0x48))->_M_t).
                                                  super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>
                                                  .super__Head_base<0UL,_spdlog::formatter_*,_false>
                                                  ._M_head_impl + 4) & 1));
  std::unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>>::
  unique_ptr<spdlog::pattern_formatter,std::default_delete<spdlog::pattern_formatter>,void>
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)__fn,
             (unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
              *)__u);
  iVar3 = (int)__u;
  std::unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>::
  ~unique_ptr((unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
               *)this);
  std::
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  ::~unordered_map((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                    *)0x1d9848);
  return iVar3;
}

Assistant:

SPDLOG_INLINE std::unique_ptr<formatter> pattern_formatter::clone() const {
    custom_flags cloned_custom_formatters;
    for (auto &it : custom_handlers_) {
        cloned_custom_formatters[it.first] = it.second->clone();
    }
    auto cloned = details::make_unique<pattern_formatter>(pattern_, pattern_time_type_, eol_,
                                                          std::move(cloned_custom_formatters));
    cloned->need_localtime(need_localtime_);
#if defined(__GNUC__) && __GNUC__ < 5
    return std::move(cloned);
#else
    return cloned;
#endif
}